

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Amiga.cpp
# Opt level: O0

HalfCycles __thiscall
Amiga::ConcreteMachine::perform_bus_operation<CPU::MC68000::Microcycle<325u>>
          (ConcreteMachine *this,Microcycle<325U> *cycle,int param_2)

{
  uint16_t uVar1;
  int interrupt_level;
  ssize_t sVar2;
  HalfCycles HVar3;
  uint uVar4;
  size_t __nbytes;
  void *__buf;
  void *extraout_RDX;
  void *__buf_00;
  Changes CVar5;
  LogLine local_d0;
  ushort local_c8;
  byte local_c6;
  byte local_c5;
  uint local_c4;
  uint16_t result;
  bool select_b;
  bool select_a;
  int reg;
  uint32_t address;
  int local_58;
  WrappedInt<HalfCycles> local_50;
  WrappedInt<HalfCycles> local_48;
  WrappedInt<HalfCycles> local_30;
  HalfCycles total_length;
  int param_2_local;
  Microcycle<325U> *cycle_local;
  ConcreteMachine *this_local;
  
  total_length.super_WrappedInt<HalfCycles>.length_._4_4_ = param_2;
  HalfCycles::HalfCycles((HalfCycles *)&local_30);
  local_48.length_ = (cycle->length).super_WrappedInt<HalfCycles>.length_;
  local_30.length_ = local_48.length_;
  CVar5 = Chipset::run_for(&this->chipset_,(HalfCycles)local_48.length_);
  local_50.length_ = (IntType)CVar5.duration.super_WrappedInt<HalfCycles>.length_;
  local_58 = CVar5.interrupt_level;
  interrupt_level = Chipset::get_interrupt_level(&this->chipset_);
  CPU::MC68000::Processor<Amiga::ConcreteMachine,_true,_true,_false>::set_interrupt_level
            (&this->mc68000_,interrupt_level);
  _result = CPU::MC68000::Microcycle<325U>::host_endian_byte_address(cycle);
  CPU::MC68000::Processor<Amiga::ConcreteMachine,_true,_true,_false>::set_is_peripheral_address
            (&this->mc68000_,(_result & 0xe00000) == 0xa00000);
  __nbytes = (ulong)(_result >> 0x12) * 0x10;
  if ((this->memory_).regions[_result >> 0x12].read_write_mask == 0) {
    if ((_result & 0xe00000) == 0xa00000) {
      local_c4 = _result >> 8;
      local_c5 = ((_result & 0x1000) != 0 ^ 0xffU) & 1;
      local_c6 = ((_result & 0x2000) != 0 ^ 0xffU) & 1;
      local_c8 = 0xffff;
      __buf_00 = __buf;
      if (local_c5 != 0) {
        sVar2 = MOS::MOS6526::MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1>::
                read(&(this->chipset_).cia_a,local_c4,__buf,__nbytes);
        uVar4 = (uint)sVar2 & 0xff | 0xff00;
        __nbytes = (size_t)uVar4;
        local_c8 = local_c8 & (ushort)uVar4;
        __buf_00 = extraout_RDX;
      }
      if ((local_c6 & 1) != 0) {
        sVar2 = MOS::MOS6526::MOS6526<Amiga::Chipset::CIABHandler,_(MOS::MOS6526::Personality)1>::
                read(&(this->chipset_).cia_b,local_c4,__buf_00,__nbytes);
        local_c8 = local_c8 & ((ushort)(((uint)sVar2 & 0xff) << 8) | 0xff);
      }
      CPU::MC68000::Microcycle<325U>::set_value16(cycle,local_c8);
    }
    else if ((_result < 0xdff000) || (0xdff1be < _result)) {
      if ((_result < 0xe80000) || (0xe8ffff < _result)) {
        CPU::MC68000::Microcycle<325U>::set_value16(cycle,0xffff);
        if (_result < 0xf00000) {
          Log::Logger<(Log::Source)2>::error((Logger<(Log::Source)2> *)&local_d0);
          uVar4 = *cycle->address;
          uVar1 = CPU::MC68000::Microcycle<325U>::value16(cycle);
          Log::Logger<(Log::Source)2>::LogLine::append
                    (&local_d0,"Unmapped %s %06x of %04x","read from ",(ulong)(uVar4 & 0xffffff),
                     (ulong)uVar1);
          Log::Logger<(Log::Source)2>::LogLine::~LogLine(&local_d0);
        }
      }
      else {
        MemoryMap::perform<CPU::MC68000::Microcycle<325u>>(&this->memory_,cycle);
      }
    }
    else {
      Chipset::perform<CPU::MC68000::Microcycle<325u>>(&this->chipset_,cycle);
    }
  }
  else {
    CPU::MC68000::Microcycle<325U>::apply
              (cycle,(this->memory_).regions[_result >> 0x12].contents + _result,
               (this->memory_).regions[_result >> 0x12].read_write_mask);
  }
  HVar3 = WrappedInt<HalfCycles>::operator-(&local_30,&cycle->length);
  return (HalfCycles)HVar3.super_WrappedInt<HalfCycles>.length_.length_;
}

Assistant:

HalfCycles perform_bus_operation(const Microcycle &cycle, int) {
			// Do a quick advance check for Chip RAM access; add a suitable delay if required.
			HalfCycles total_length;
			if(cycle.operation & CPU::MC68000::Operation::NewAddress && *cycle.address < 0x20'0000) {
				total_length = chipset_.run_until_after_cpu_slot().duration;
				assert(total_length >= cycle.length);
			} else {
				total_length = cycle.length;
				chipset_.run_for(total_length);
			}
			mc68000_.set_interrupt_level(chipset_.get_interrupt_level());

			// Check for assertion of reset.
			if(cycle.operation & CPU::MC68000::Operation::Reset) {
				memory_.reset();
				logger.info().append("Reset; PC is around %08x", mc68000_.get_state().registers.program_counter);
			}

			// Autovector interrupts.
			if(cycle.operation & CPU::MC68000::Operation::InterruptAcknowledge) {
				mc68000_.set_is_peripheral_address(true);
				return total_length - cycle.length;
			}

			// Do nothing if no address is exposed.
			if(!(cycle.operation & (CPU::MC68000::Operation::NewAddress | CPU::MC68000::Operation::SameAddress))) return total_length - cycle.length;

			// Grab the target address to pick a memory source.
			const uint32_t address = cycle.host_endian_byte_address();

			// Set VPA if this is [going to be] a CIA access.
			mc68000_.set_is_peripheral_address((address & 0xe0'0000) == 0xa0'0000);

			if(!memory_.regions[address >> 18].read_write_mask) {
				if((cycle.operation & (CPU::MC68000::Operation::SelectByte | CPU::MC68000::Operation::SelectWord))) {
					// Check for various potential chip accesses.

					// Per the manual:
					//
					// CIA A is: 101x xxxx xx01 rrrr xxxx xxx0 (i.e. loaded into high byte)
					// CIA B is: 101x xxxx xx10 rrrr xxxx xxx1 (i.e. loaded into low byte)
					//
					// but in order to map 0xbfexxx to CIA A and 0xbfdxxx to CIA B, I think
					// these might be listed the wrong way around.
					//
					// Additional assumption: the relevant CIA select lines are connected
					// directly to the chip enables.
					if((address & 0xe0'0000) == 0xa0'0000) {
						const int reg = address >> 8;
						const bool select_a = !(address & 0x1000);
						const bool select_b = !(address & 0x2000);

						if(cycle.operation & CPU::MC68000::Operation::Read) {
							uint16_t result = 0xffff;
							if(select_a) result &= 0xff00 | (chipset_.cia_a.read(reg) << 0);
							if(select_b) result &= 0x00ff | (chipset_.cia_b.read(reg) << 8);
							cycle.set_value16(result);
						} else {
							if(select_a) chipset_.cia_a.write(reg, cycle.value8_low());
							if(select_b) chipset_.cia_b.write(reg, cycle.value8_high());
						}

//						logger.info().append("CIA %d %s %d of %04x", ((address >> 12) & 3)^3, operation & Microcycle::Read ? "read" : "write", reg & 0xf, cycle.value16());
					} else if(address >= 0xdf'f000 && address <= 0xdf'f1be) {
						chipset_.perform(cycle);
					} else if(address >= 0xe8'0000 && address < 0xe9'0000) {
						// This is the Autoconf space; right now the only
						// Autoconf device this emulator implements is fast RAM,
						// which if present is provided as part of the memory map.
						//
						// Relevant quote: "The Zorro II configuration space is the 64K memory block $00E8xxxx"
						memory_.perform(cycle);
					} else {
						// This'll do for open bus, for now.
						if(cycle.operation & CPU::MC68000::Operation::Read) {
							cycle.set_value16(0xffff);
						}

						// Log only for the region that is definitely not just ROM this machine doesn't have.
						if(address < 0xf0'0000) {
							logger.error().append("Unmapped %s %06x of %04x", cycle.operation & CPU::MC68000::Operation::Read ? "read from " : "write to ", (*cycle.address)&0xffffff, cycle.value16());
						}
					}
				}
			} else {
				// A regular memory access.
				cycle.apply(
					&memory_.regions[address >> 18].contents[address],
					memory_.regions[address >> 18].read_write_mask
				);
			}

			return total_length - cycle.length;
		}